

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::Statistics::print(Statistics *this,ostream *os)

{
  ostream *poVar1;
  ostream *poVar2;
  ostream *poVar3;
  ostream *poVar4;
  ostream *in_RSI;
  undefined8 *in_RDI;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  avgDualDegeneracy;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  avgPrimalDegeneracy;
  Real otherTime;
  Real totTime;
  Real solTime;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffdc0;
  double in_stack_fffffffffffffdc8;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffdd0;
  undefined8 local_180;
  int local_174;
  undefined1 local_170 [56];
  undefined8 local_138;
  undefined1 local_130 [56];
  double local_f8;
  double local_f0;
  ostream *local_e8;
  ostream *local_e0;
  undefined8 local_d0;
  undefined8 *local_c8;
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined8 *local_b0;
  undefined1 *local_a8;
  undefined8 *local_a0;
  undefined8 *local_98;
  long local_90;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_81;
  int *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  int *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  long local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  int *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  int *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_e0 = in_RSI;
  local_e8 = (ostream *)(**(code **)(*(long *)in_RDI[1] + 0x30))();
  local_f0 = (double)(**(code **)(*(long *)*in_RDI + 0x30))();
  local_f0 = local_f0 + (double)local_e8;
  poVar4 = local_e8;
  dVar5 = (double)(**(code **)(*(long *)in_RDI[4] + 0x30))();
  dVar5 = (double)poVar4 - dVar5;
  dVar6 = (double)(**(code **)(*(long *)in_RDI[5] + 0x30))();
  dVar7 = (double)(**(code **)(*(long *)in_RDI[2] + 0x30))();
  dVar8 = (double)(**(code **)(*(long *)in_RDI[3] + 0x30))();
  local_f8 = (double)(**(code **)(*(long *)in_RDI[6] + 0x30))();
  local_f8 = (((dVar5 - dVar6) - dVar7) - dVar8) - local_f8;
  if (*(int *)((long)in_RDI + 0xbc) < 1) {
    local_138 = 0;
    local_c0 = local_130;
    local_c8 = &local_138;
    local_d0 = 0;
    local_98 = local_c8;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  }
  else {
    local_30 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)in_RDI + 0x17c);
    local_38 = (int *)((long)in_RDI + 0xbc);
    local_28 = local_130;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_39,local_30);
    local_20 = local_130;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffdc0);
    local_8 = local_130;
    local_10 = local_30;
    local_18 = local_38;
    local_48 = (long)*local_38;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
              (in_stack_fffffffffffffdc0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),(longlong *)0x49ddb5);
  }
  if (*(int *)(in_RDI + 0x17) - *(int *)((long)in_RDI + 0xbc) < 1) {
    local_180 = 0;
    local_a8 = local_170;
    local_b0 = &local_180;
    local_b8 = 0;
    local_a0 = local_b0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  }
  else {
    local_78 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)in_RDI + 0x144);
    local_174 = *(int *)(in_RDI + 0x17) - *(int *)((long)in_RDI + 0xbc);
    local_70 = local_170;
    local_80 = &local_174;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_81,local_78);
    local_68 = local_170;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffdc0);
    local_50 = local_170;
    local_58 = local_78;
    local_60 = local_80;
    local_90 = (long)*local_80;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
              (in_stack_fffffffffffffdc0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),(longlong *)0x49df17);
  }
  SPxOut::setFixed((ostream *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
  poVar1 = std::operator<<(local_e0,"Total time          : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_f0);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"  Reading           : ");
  dVar5 = (double)(**(code **)(*(long *)*in_RDI + 0x30))();
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar5);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"  Solving           : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)local_e8);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"  Preprocessing     : ");
  dVar5 = (double)(**(code **)(*(long *)in_RDI[2] + 0x30))();
  std::ostream::operator<<(poVar1,dVar5);
  if (0.0 < (double)local_e8) {
    poVar2 = std::operator<<(local_e0," (");
    dVar5 = (double)(**(code **)(*(long *)in_RDI[2] + 0x30))();
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(dVar5 / (double)local_e8) * 100.0);
    std::operator<<(poVar2,"% of solving time)");
  }
  poVar2 = std::operator<<(local_e0,"\n  Simplex           : ");
  dVar5 = (double)(**(code **)(*(long *)in_RDI[3] + 0x30))();
  std::ostream::operator<<(poVar2,dVar5);
  if (0.0 < (double)local_e8) {
    poVar2 = std::operator<<(local_e0," (");
    dVar5 = (double)(**(code **)(*(long *)in_RDI[3] + 0x30))();
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(dVar5 / (double)local_e8) * 100.0);
    std::operator<<(poVar2,"% of solving time)");
  }
  poVar2 = std::operator<<(local_e0,"\n  Synchronization   : ");
  dVar5 = (double)(**(code **)(*(long *)in_RDI[4] + 0x30))();
  std::ostream::operator<<(poVar2,dVar5);
  if (0.0 < (double)local_e8) {
    poVar2 = std::operator<<(local_e0," (");
    dVar5 = (double)(**(code **)(*(long *)in_RDI[4] + 0x30))();
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(dVar5 / (double)local_e8) * 100.0);
    std::operator<<(poVar2,"% of solving time)");
  }
  poVar2 = std::operator<<(local_e0,"\n  Transformation    : ");
  dVar5 = (double)(**(code **)(*(long *)in_RDI[5] + 0x30))();
  std::ostream::operator<<(poVar2,dVar5);
  if (0.0 < (double)local_e8) {
    poVar2 = std::operator<<(local_e0," (");
    dVar5 = (double)(**(code **)(*(long *)in_RDI[5] + 0x30))();
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(dVar5 * 100.0) / (double)local_e8);
    std::operator<<(poVar2,"% of solving time)");
  }
  poVar2 = std::operator<<(local_e0,"\n  Rational          : ");
  dVar5 = (double)(**(code **)(*(long *)in_RDI[6] + 0x30))();
  std::ostream::operator<<(poVar2,dVar5);
  if (0.0 < (double)local_e8) {
    poVar2 = std::operator<<(local_e0," (");
    dVar5 = (double)(**(code **)(*(long *)in_RDI[6] + 0x30))();
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(dVar5 * 100.0) / (double)local_e8);
    std::operator<<(poVar2,"% of solving time)");
  }
  poVar2 = std::operator<<(local_e0,"\n  InitialPrecision  : ");
  dVar5 = (double)(**(code **)(*(long *)in_RDI[7] + 0x30))();
  std::ostream::operator<<(poVar2,dVar5);
  if (0.0 < (double)local_e8) {
    poVar2 = std::operator<<(local_e0," (");
    dVar5 = (double)(**(code **)(*(long *)in_RDI[7] + 0x30))();
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(dVar5 * 100.0) / (double)local_e8);
    std::operator<<(poVar2,"% of solving time)");
  }
  poVar2 = std::operator<<(local_e0,"\n  ExtendedPrecision : ");
  dVar5 = (double)(**(code **)(*(long *)in_RDI[8] + 0x30))();
  std::ostream::operator<<(poVar2,dVar5);
  if (0.0 < (double)local_e8) {
    poVar2 = std::operator<<(local_e0," (");
    dVar5 = (double)(**(code **)(*(long *)in_RDI[8] + 0x30))();
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(dVar5 * 100.0) / (double)local_e8);
    std::operator<<(poVar2,"% of solving time)");
  }
  poVar2 = std::operator<<(local_e0,"\n  BoostingStep      : ");
  dVar5 = (double)(**(code **)(*(long *)in_RDI[10] + 0x30))();
  std::ostream::operator<<(poVar2,dVar5);
  if (0.0 < (double)local_e8) {
    poVar2 = std::operator<<(local_e0," (");
    dVar5 = (double)(**(code **)(*(long *)in_RDI[10] + 0x30))();
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(dVar5 * 100.0) / (double)local_e8);
    std::operator<<(poVar2,"% of solving time)");
  }
  poVar2 = std::operator<<(local_e0,"\n  FpTime            : ");
  std::ostream::operator<<(poVar2,(double)in_RDI[0x16]);
  if (0.0 < (double)local_e8) {
    poVar2 = std::operator<<(local_e0," (");
    poVar2 = (ostream *)
             std::ostream::operator<<(poVar2,((double)in_RDI[0x16] * 100.0) / (double)local_e8);
    std::operator<<(poVar2,"% of solving time)");
  }
  poVar2 = std::operator<<(local_e0,"\n  Other             : ");
  std::ostream::operator<<(poVar2,local_f8);
  if (0.0 < (double)local_e8) {
    poVar2 = std::operator<<(local_e0," (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(local_f8 * 100.0) / (double)local_e8);
    std::operator<<(poVar2,"% of solving time)");
  }
  poVar2 = std::operator<<(local_e0,"\nRefinements         : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)((long)in_RDI + 0xf4));
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"  Stalling          : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x1f));
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"  Pivoting          : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)((long)in_RDI + 0xfc));
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"  Feasibility       : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x20));
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"  Unboundedness     : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)((long)in_RDI + 0x104));
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(local_e0,"Precision boosts    : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x21));
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"  Stalling          : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)((long)in_RDI + 0x10c));
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"  Pivoting          : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x22));
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"  Feasibility       : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)((long)in_RDI + 0x114));
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"  Unboundedness     : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x23));
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(local_e0,"Iterations          : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x17));
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"  From scratch      : ");
  std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x17) - *(int *)(in_RDI + 0x18));
  if (0 < *(int *)(in_RDI + 0x17)) {
    poVar2 = std::operator<<(local_e0," (");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,((double)(*(int *)(in_RDI + 0x17) - *(int *)(in_RDI + 0x18)) * 100.0)
                               / (double)*(int *)(in_RDI + 0x17));
    std::operator<<(poVar2,"%)");
  }
  poVar2 = std::operator<<(local_e0,"\n  From basis        : ");
  std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x18));
  if (0 < *(int *)(in_RDI + 0x17)) {
    poVar2 = std::operator<<(local_e0," (");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,((double)*(int *)(in_RDI + 0x18) * 100.0) /
                               (double)*(int *)(in_RDI + 0x17));
    std::operator<<(poVar2,"%)");
  }
  poVar2 = std::operator<<(local_e0,"\n  Primal            : ");
  std::ostream::operator<<(poVar2,*(int *)((long)in_RDI + 0xbc));
  if (0 < *(int *)(in_RDI + 0x17)) {
    poVar2 = std::operator<<(local_e0," (");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,((double)*(int *)((long)in_RDI + 0xbc) * 100.0) /
                               (double)*(int *)(in_RDI + 0x17));
    std::operator<<(poVar2,"%)");
  }
  poVar2 = std::operator<<(local_e0,"\n  Dual              : ");
  std::ostream::operator<<
            (poVar2,(*(int *)(in_RDI + 0x17) - *(int *)((long)in_RDI + 0xbc)) -
                    *(int *)((long)in_RDI + 0xc4));
  if (0 < *(int *)(in_RDI + 0x17)) {
    poVar2 = std::operator<<(local_e0," (");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,((double)(*(int *)(in_RDI + 0x17) - *(int *)((long)in_RDI + 0xbc)) *
                               100.0) / (double)*(int *)(in_RDI + 0x17));
    std::operator<<(poVar2,"%)");
  }
  poVar2 = std::operator<<(local_e0,"\n  Bound flips       : ");
  std::ostream::operator<<(poVar2,*(int *)((long)in_RDI + 0xcc));
  poVar2 = std::operator<<(local_e0,"\n  Sol. polishing    : ");
  std::ostream::operator<<(poVar2,*(int *)((long)in_RDI + 0xc4));
  poVar2 = std::operator<<(local_e0,"\n  First FP solve    : ");
  std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x19));
  poVar2 = std::operator<<(local_e0,"\nIterationsBoosted   : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x1a));
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"  From scratch      : ");
  std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x1a) - *(int *)(in_RDI + 0x1b));
  if (0 < *(int *)(in_RDI + 0x1a)) {
    poVar2 = std::operator<<(local_e0," (");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,((double)(*(int *)(in_RDI + 0x1a) - *(int *)(in_RDI + 0x1b)) * 100.0)
                               / (double)*(int *)(in_RDI + 0x1a));
    std::operator<<(poVar2,"%)");
  }
  poVar2 = std::operator<<(local_e0,"\n  From basis        : ");
  std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x1b));
  if (0 < *(int *)(in_RDI + 0x1a)) {
    poVar2 = std::operator<<(local_e0," (");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,((double)*(int *)(in_RDI + 0x1b) * 100.0) /
                               (double)*(int *)(in_RDI + 0x1a));
    std::operator<<(poVar2,"%)");
  }
  poVar2 = std::operator<<(local_e0,"\n  Primal            : ");
  std::ostream::operator<<(poVar2,*(int *)((long)in_RDI + 0xd4));
  if (0 < *(int *)(in_RDI + 0x1a)) {
    poVar2 = std::operator<<(local_e0," (");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,((double)*(int *)((long)in_RDI + 0xd4) * 100.0) /
                               (double)*(int *)(in_RDI + 0x1a));
    std::operator<<(poVar2,"%)");
  }
  poVar2 = std::operator<<(local_e0,"\n  Dual              : ");
  std::ostream::operator<<
            (poVar2,(*(int *)(in_RDI + 0x1a) - *(int *)((long)in_RDI + 0xd4)) -
                    *(int *)((long)in_RDI + 0xdc));
  if (0 < *(int *)(in_RDI + 0x1a)) {
    poVar2 = std::operator<<(local_e0," (");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,((double)(*(int *)(in_RDI + 0x1a) - *(int *)((long)in_RDI + 0xd4)) *
                               100.0) / (double)*(int *)(in_RDI + 0x1a));
    std::operator<<(poVar2,"%)");
  }
  poVar2 = std::operator<<(local_e0,"\n  Bound flips       : ");
  std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x1c));
  poVar2 = std::operator<<(local_e0,"\n  Sol. polishing    : ");
  std::ostream::operator<<(poVar2,*(int *)((long)in_RDI + 0xdc));
  poVar2 = std::operator<<(local_e0,"\nLU factorizations   : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)((long)in_RDI + 0xe4));
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,"  Factor. frequency : ");
  if (*(int *)((long)in_RDI + 0xe4) < 1) {
    std::operator<<(local_e0,"-\n");
  }
  else {
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (local_e0,(double)*(int *)(in_RDI + 0x17) /
                                 (double)*(int *)((long)in_RDI + 0xe4));
    std::operator<<(poVar2," iterations per factorization\n");
  }
  poVar2 = std::operator<<(local_e0,"  Factor. time      : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)in_RDI[0x12]);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(local_e0,"LU solves           : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x1d));
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,"  Solve frequency   : ");
  if (*(int *)(in_RDI + 0x17) < 1) {
    std::operator<<(local_e0,"-\n");
  }
  else {
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (local_e0,(double)*(int *)(in_RDI + 0x1d) / (double)*(int *)(in_RDI + 0x17));
    std::operator<<(poVar2," solves per iteration\n");
  }
  poVar2 = std::operator<<(local_e0,"  Solve time        : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)in_RDI[0x13]);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(local_e0,"Matrix-Vector ops   : \n");
  poVar2 = std::operator<<(poVar2,"  Sparse    time    : ");
  std::ostream::operator<<(poVar2,(double)in_RDI[0xc]);
  if (0.0 < (double)local_e8) {
    poVar2 = std::operator<<(local_e0," (");
    poVar2 = (ostream *)
             std::ostream::operator<<(poVar2,((double)in_RDI[0xc] / (double)local_e8) * 100.0);
    std::operator<<(poVar2,"% of solving time)");
  }
  poVar2 = std::operator<<(local_e0,"\n            calls   : ");
  std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x10));
  poVar2 = std::operator<<(local_e0," (");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,((double)*(int *)(in_RDI + 0x10) /
                             ((double)*(int *)(in_RDI + 0x17) + 0.01)) * 100.0);
  std::operator<<(poVar2,"% of iterations)");
  poVar2 = std::operator<<(local_e0,"\n  Full      time    : ");
  std::ostream::operator<<(poVar2,(double)in_RDI[0xd]);
  if (0.0 < (double)local_e8) {
    poVar2 = std::operator<<(local_e0," (");
    poVar2 = (ostream *)
             std::ostream::operator<<(poVar2,((double)in_RDI[0xd] / (double)local_e8) * 100.0);
    std::operator<<(poVar2,"% of solving time)");
  }
  poVar2 = std::operator<<(local_e0,"\n            calls   : ");
  std::ostream::operator<<(poVar2,*(int *)((long)in_RDI + 0x84));
  poVar2 = std::operator<<(local_e0," (");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,((double)*(int *)((long)in_RDI + 0x84) /
                             ((double)*(int *)(in_RDI + 0x17) + 0.01)) * 100.0);
  std::operator<<(poVar2,"% of iterations)");
  poVar2 = std::operator<<(local_e0,"\n  Colwise   time    : ");
  std::ostream::operator<<(poVar2,(double)in_RDI[0xe]);
  if (0.0 < (double)local_e8) {
    poVar2 = std::operator<<(local_e0," (");
    poVar2 = (ostream *)
             std::ostream::operator<<(poVar2,((double)in_RDI[0xe] / (double)local_e8) * 100.0);
    std::operator<<(poVar2,"% of solving time)");
  }
  poVar2 = std::operator<<(local_e0,"\n            calls   : ");
  std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x11));
  poVar2 = std::operator<<(local_e0," (");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,((double)*(int *)(in_RDI + 0x11) /
                             ((double)*(int *)(in_RDI + 0x17) + 0.01)) * 100.0);
  std::operator<<(poVar2,"% of iterations)");
  poVar2 = std::operator<<(local_e0,"\n  Unsetup   time    : ");
  std::ostream::operator<<(poVar2,(double)in_RDI[0xf]);
  if (0.0 < (double)local_e8) {
    poVar2 = std::operator<<(local_e0," (");
    poVar2 = (ostream *)
             std::ostream::operator<<(poVar2,((double)in_RDI[0xf] / (double)local_e8) * 100.0);
    std::operator<<(poVar2,"% of solving time)");
  }
  poVar2 = std::operator<<(local_e0,"\n            calls   : ");
  std::ostream::operator<<(poVar2,*(int *)((long)in_RDI + 0x8c));
  poVar2 = std::operator<<(local_e0," (");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,((double)*(int *)((long)in_RDI + 0x8c) /
                             ((double)*(int *)(in_RDI + 0x17) + 0.01)) * 100.0);
  std::operator<<(poVar2,"% of iterations)");
  std::operator<<(local_e0,"\n");
  poVar2 = std::operator<<(local_e0,"Rat. factorizations : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)((long)in_RDI + 0xec));
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"  Rat. factor. time : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)in_RDI[0x14]);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"  Rat. solve time   : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)in_RDI[0x15]);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(local_e0,"Rat. reconstructions: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x1e));
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"  Rat. rec. time    : ");
  dVar5 = (double)(**(code **)(*(long *)in_RDI[9] + 0x30))();
  poVar3 = (ostream *)std::ostream::operator<<(poVar2,dVar5);
  std::operator<<(poVar3,"\n");
  std::operator<<(local_e0,"Degeneracy          : \n");
  poVar3 = std::operator<<(local_e0,"  Primal Pivots     : ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)in_RDI + 0x134));
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(local_e0,"  Dual Pivots       : ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x27));
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(local_e0,"  Primal Candidates : ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)in_RDI + 0x13c));
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(local_e0,"  Dual Candidates   : ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x28));
  std::operator<<(poVar3,"\n");
  std::operator<<(local_e0,"  Average Primal    : ");
  poVar3 = boost::multiprecision::operator<<
                     (poVar4,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)poVar1);
  std::operator<<(poVar3,"\n");
  std::operator<<(local_e0,"  Average Dual      : ");
  poVar3 = boost::multiprecision::operator<<
                     (poVar4,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)poVar1);
  std::operator<<(poVar3,"\n");
  if (0 < *(int *)(in_RDI + 0x24)) {
    poVar3 = std::operator<<(local_e0,"Algorithm Iterations: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)in_RDI + 0x11c));
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(local_e0,"  Total             : ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,*(int *)(in_RDI + 0x24) + *(int *)((long)in_RDI + 0x124));
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(local_e0,"  Initial           : ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x24));
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(local_e0,"  Reduced Problem   : ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)in_RDI + 0x124));
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(local_e0,"  Comp. Problem     : ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x25));
    std::operator<<(poVar3,"\n");
    std::operator<<(local_e0,"Red. Problem Size   : \n");
    poVar3 = std::operator<<(local_e0,"  Rows              : ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)in_RDI + 300));
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(local_e0,"  Columns           : ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x26));
    std::operator<<(poVar3,"\n");
    SPxOut::setScientific(poVar2,in_stack_fffffffffffffdbc);
    SPxOut::setFixed(poVar2,in_stack_fffffffffffffdbc);
    poVar3 = std::operator<<(local_e0,"Red. Problem Status : ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)in_RDI + 0x294));
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(local_e0,"Comp. Problem Status: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x53));
    std::operator<<(poVar3,"\n");
    SPxOut::setScientific(poVar2,in_stack_fffffffffffffdbc);
    std::operator<<(local_e0,"Comp. Problem Obj.  : ");
    poVar3 = boost::multiprecision::operator<<
                       (poVar4,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)poVar1);
    std::operator<<(poVar3,"\n");
  }
  SPxOut::setScientific(poVar2,in_stack_fffffffffffffdbc);
  std::operator<<(local_e0,"Numerics            :\n");
  std::operator<<(local_e0,"  Condition Number  : ");
  poVar4 = boost::multiprecision::operator<<
                     (poVar4,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)poVar1);
  std::operator<<(poVar4,"\n");
  return;
}

Assistant:

void SoPlexBase<R>::Statistics::print(std::ostream& os)
{
   Real solTime = solvingTime->time();
   Real totTime = readingTime->time() + solTime;
   Real otherTime = solTime - syncTime->time() - transformTime->time() - preprocessingTime->time() -
                    simplexTime->time() - rationalTime->time();

   R avgPrimalDegeneracy = iterationsPrimal > 0 ? sumPrimalDegen / iterationsPrimal : 0.0;
   R avgDualDegeneracy = (iterations - iterationsPrimal) > 0 ?
                         (sumDualDegen / (iterations - iterationsPrimal)) : 0.0;

   SPxOut::setFixed(os, 2);

   os << "Total time          : " << totTime << "\n"
      << "  Reading           : " << readingTime->time() << "\n"
      << "  Solving           : " << solTime << "\n"
      << "  Preprocessing     : " << preprocessingTime->time();

   if(solTime > 0)
      os << " (" << 100 * (preprocessingTime->time() / solTime) << "% of solving time)";

   os << "\n  Simplex           : " << simplexTime->time();

   if(solTime > 0)
      os << " (" << 100 * (simplexTime->time() / solTime) << "% of solving time)";

   os << "\n  Synchronization   : " << syncTime->time();

   if(solTime > 0)
      os << " (" << 100 * (syncTime->time() / solTime) << "% of solving time)";

   os << "\n  Transformation    : " << transformTime->time();

   if(solTime > 0)
      os << " (" << 100 * transformTime->time() / solTime << "% of solving time)";

   os << "\n  Rational          : " << rationalTime->time();

   if(solTime > 0)
      os << " (" << 100 * rationalTime->time() / solTime << "% of solving time)";

   os << "\n  InitialPrecision  : " << initialPrecisionTime->time();

   if(solTime > 0)
      os << " (" << 100 * initialPrecisionTime->time() / solTime << "% of solving time)";

   os << "\n  ExtendedPrecision : " << extendedPrecisionTime->time();

   if(solTime > 0)
      os << " (" << 100 * extendedPrecisionTime->time() / solTime << "% of solving time)";

   os << "\n  BoostingStep      : " << boostingStepTime->time();

   if(solTime > 0)
      os << " (" << 100 * boostingStepTime->time() / solTime << "% of solving time)";

   os << "\n  FpTime            : " << fpTime;

   if(solTime > 0)
      os << " (" << 100 * fpTime / solTime << "% of solving time)";

   os << "\n  Other             : " << otherTime;

   if(solTime > 0)
      os << " (" << 100 * otherTime / solTime << "% of solving time)";

   os << "\nRefinements         : " << refinements << "\n"
      << "  Stalling          : " << stallRefinements << "\n"
      << "  Pivoting          : " << pivotRefinements << "\n"
      << "  Feasibility       : " << feasRefinements << "\n"
      << "  Unboundedness     : " << unbdRefinements << "\n";

   os << "Precision boosts    : " << precBoosts << "\n"
      << "  Stalling          : " << stallPrecBoosts << "\n"
      << "  Pivoting          : " << pivotPrecBoosts << "\n"
      << "  Feasibility       : " << feasPrecBoosts << "\n"
      << "  Unboundedness     : " << unbdPrecBoosts << "\n";

   os << "Iterations          : " << iterations << "\n"
      << "  From scratch      : " << iterations - iterationsFromBasis;

   if(iterations > 0)
      os << " (" << 100 * double((iterations - iterationsFromBasis)) / double(iterations) << "%)";

   os << "\n  From basis        : " << iterationsFromBasis;

   if(iterations > 0)
      os << " (" << 100 * double(iterationsFromBasis) / double(iterations) << "%)";

   os << "\n  Primal            : " << iterationsPrimal;

   if(iterations > 0)
      os << " (" << 100 * double(iterationsPrimal) / double(iterations) << "%)";

   os << "\n  Dual              : " << iterations - iterationsPrimal - iterationsPolish;

   if(iterations > 0)
      os << " (" << 100 * double((iterations - iterationsPrimal)) / double(iterations) << "%)";

   os << "\n  Bound flips       : " << boundflips;
   os << "\n  Sol. polishing    : " << iterationsPolish;
   os << "\n  First FP solve    : " << iterationsFP;

   os << "\nIterationsBoosted   : " << boostedIterations << "\n"
      << "  From scratch      : " << int(boostedIterations - boostedIterationsFromBasis);

   if(boostedIterations > 0)
      os << " (" << 100 * double((boostedIterations - boostedIterationsFromBasis)) / double(
            boostedIterations) << "%)";

   os << "\n  From basis        : " << boostedIterationsFromBasis;

   if(boostedIterations > 0)
      os << " (" << 100 * double(boostedIterationsFromBasis) / double(boostedIterations) << "%)";

   os << "\n  Primal            : " << boostedIterationsPrimal;

   if(boostedIterations > 0)
      os << " (" << 100 * double(boostedIterationsPrimal) / double(boostedIterations) << "%)";

   os << "\n  Dual              : " << boostedIterations - boostedIterationsPrimal -
      boostedIterationsPolish;

   if(boostedIterations > 0)
      os << " (" << 100 * double((boostedIterations - boostedIterationsPrimal)) / double(
            boostedIterations) << "%)";

   os << "\n  Bound flips       : " << boostedBoundflips;
   os << "\n  Sol. polishing    : " << boostedIterationsPolish;

   os << "\nLU factorizations   : " << luFactorizationsReal << "\n"
      << "  Factor. frequency : ";

   if(luFactorizationsReal > 0)
      os << double(iterations) / double(luFactorizationsReal) << " iterations per factorization\n";
   else
      os << "-\n";

   os << "  Factor. time      : " << luFactorizationTimeReal << "\n";

   os << "LU solves           : " << luSolvesReal << "\n"
      << "  Solve frequency   : ";

   if(iterations > 0)
      os << double(luSolvesReal) / double(iterations) << " solves per iteration\n";
   else
      os << "-\n";

   os << "  Solve time        : " << luSolveTimeReal << "\n";

   os << "Matrix-Vector ops   : \n"
      << "  Sparse    time    : " << multTimeSparse;

   if(solTime > 0)
      os << " (" << 100 * (multTimeSparse / solTime) << "% of solving time)";

   os << "\n            calls   : " << multSparseCalls;
   os << " (" << 100 * (multSparseCalls / (0.01 + iterations)) << "% of iterations)";
   os << "\n  Full      time    : " << multTimeFull;

   if(solTime > 0)
      os << " (" << 100 * (multTimeFull / solTime) << "% of solving time)";

   os << "\n            calls   : " << multFullCalls;
   os << " (" << 100 * (multFullCalls / (0.01 + iterations)) << "% of iterations)";
   os << "\n  Colwise   time    : " << multTimeColwise;

   if(solTime > 0)
      os << " (" << 100 * (multTimeColwise / solTime) << "% of solving time)";

   os << "\n            calls   : " << multColwiseCalls;
   os << " (" << 100 * (multColwiseCalls / (0.01 + iterations)) << "% of iterations)";
   os << "\n  Unsetup   time    : " << multTimeUnsetup;

   if(solTime > 0)
      os << " (" << 100 * (multTimeUnsetup / solTime) << "% of solving time)";

   os << "\n            calls   : " << multUnsetupCalls;
   os << " (" << 100 * (multUnsetupCalls / (0.01 + iterations)) << "% of iterations)";
   os << "\n";

   os << "Rat. factorizations : " << luFactorizationsRational << "\n"
      << "  Rat. factor. time : " << luFactorizationTimeRational << "\n"
      << "  Rat. solve time   : " << luSolveTimeRational << "\n";

   os << "Rat. reconstructions: " << rationalReconstructions << "\n"
      << "  Rat. rec. time    : " << reconstructionTime->time() << "\n";

   os << "Degeneracy          : \n";
   os << "  Primal Pivots     : " << degenPivotsPrimal << "\n";
   os << "  Dual Pivots       : " << degenPivotsDual << "\n";
   os << "  Primal Candidates : " << degenPivotCandPrimal << "\n";
   os << "  Dual Candidates   : " << degenPivotCandDual << "\n";
   os << "  Average Primal    : " << avgPrimalDegeneracy << "\n";
   os << "  Average Dual      : " << avgDualDegeneracy << "\n";

   if(iterationsInit > 0)
   {
      os << "Algorithm Iterations: " << callsReducedProb << "\n";
      os << "  Total             : " << iterationsInit + iterationsRedProb << "\n";
      os << "  Initial           : " << iterationsInit << "\n";
      os << "  Reduced Problem   : " << iterationsRedProb << "\n";
      os << "  Comp. Problem     : " << iterationsCompProb << "\n";
      os << "Red. Problem Size   : \n";
      os << "  Rows              : " << numRedProbRows << "\n";
      os << "  Columns           : " << numRedProbCols << "\n";

      SPxOut::setScientific(os, 16);

      SPxOut::setFixed(os, 2);

      os << "Red. Problem Status : " << redProbStatus << "\n";
      os << "Comp. Problem Status: " << compProbStatus << "\n";

      SPxOut::setScientific(os, 16);

      os << "Comp. Problem Obj.  : " << finalCompObj << "\n";
   }

   SPxOut::setScientific(os);

   os << "Numerics            :\n";
   os << "  Condition Number  : " << finalBasisCondition << "\n";

}